

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O1

void __thiscall QUrlQuery::setQueryItems(QUrlQuery *this,QList<std::pair<QString,_QString>_> *query)

{
  long lVar1;
  QUrlQueryPrivate *this_00;
  pair<QString,_QString> *key;
  pair<QString,_QString> *ppVar2;
  
  clear(this);
  if ((query->d).size != 0) {
    QSharedDataPointer<QUrlQueryPrivate>::detach(&this->d);
    lVar1 = (query->d).size;
    if (lVar1 != 0) {
      this_00 = (this->d).d.ptr;
      key = (query->d).ptr;
      ppVar2 = key + lVar1;
      do {
        QUrlQueryPrivate::addQueryItem(this_00,&key->first,&key->second);
        key = key + 1;
      } while (key != ppVar2);
    }
  }
  return;
}

Assistant:

void QUrlQuery::setQueryItems(const QList<std::pair<QString, QString> > &query)
{
    clear();
    if (query.isEmpty())
        return;

    QUrlQueryPrivate *dd = d;
    QList<std::pair<QString, QString> >::const_iterator it = query.constBegin(),
            end = query.constEnd();
    for ( ; it != end; ++it)
        dd->addQueryItem(it->first, it->second);
}